

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

bool __thiscall
MasterObjectHolder::removeFed(MasterObjectHolder *this,string_view fedName,int validationCode)

{
  __uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *p_Var1;
  FedObject *pFVar2;
  element_type *peVar3;
  bool bVar4;
  __uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *p_Var5;
  unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *fed;
  __uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *this_00;
  bool bVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  handle handle;
  _Map_pointer local_50;
  handle local_48;
  
  gmlc::libguarded::
  guarded<std::deque<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>,_std::mutex>
  ::lock(&local_48,&this->feds);
  this_00 = (__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
            ((local_48.data)->
            super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  p_Var5 = (__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
           ((local_48.data)->
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_50 = ((local_48.data)->
             super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_node;
  p_Var1 = (__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
           ((local_48.data)->
           super__Deque_base<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>,_std::allocator<std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  bVar6 = false;
  while (this_00 != p_Var1) {
    pFVar2 = (this_00->_M_t).
             super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>.
             super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl;
    if ((pFVar2 != (FedObject *)0x0) &&
       (peVar3 = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr, peVar3 != (element_type *)0x0)) {
      __y._M_str = (peVar3->mName)._M_dataplus._M_p;
      __y._M_len = (peVar3->mName)._M_string_length;
      bVar4 = std::operator==(fedName,__y);
      if ((bVar4) &&
         (pFVar2 = (this_00->_M_t).
                   super__Tuple_impl<0UL,_helics::FedObject_*,_std::default_delete<helics::FedObject>_>
                   .super__Head_base<0UL,_helics::FedObject_*,_false>._M_head_impl,
         pFVar2->valid == validationCode)) {
        pFVar2->valid = 0;
        std::__shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&(pFVar2->fedptr).
                    super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>);
        std::__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_>::reset
                  (this_00,(pointer)0x0);
        bVar6 = true;
      }
    }
    this_00 = this_00 + 1;
    if (this_00 == p_Var5) {
      this_00 = (__uniq_ptr_impl<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                local_50[1];
      local_50 = local_50 + 1;
      p_Var5 = this_00 + 0x40;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48.m_handle_lock);
  return bVar6;
}

Assistant:

bool MasterObjectHolder::removeFed(std::string_view fedName, int validationCode)
{
    auto handle = feds.lock();
    bool found{false};
    for (auto& fed : (*handle)) {
        if ((fed) && (fed->fedptr)) {
            if (fed->fedptr->getName() == fedName && fed->valid == validationCode) {
                fed->valid = 0;
                fed->fedptr.reset();
                fed.reset();
                found = true;
            }
        }
    }
    return found;
}